

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

bool ProvideOption(Option *Handler,StringRef ArgName,StringRef Value,int argc,char **argv,int *i)

{
  int iVar1;
  Option *pOVar2;
  StringRef Value_00;
  StringRef ArgName_00;
  StringRef Value_01;
  StringRef ArgName_01;
  StringRef Value_02;
  StringRef ArgName_02;
  bool bVar3;
  ValueExpected VVar4;
  raw_ostream *prVar5;
  size_t sVar6;
  char *local_258;
  char *local_228;
  StringRef local_1d0;
  Twine local_1c0;
  Option *local_1a8;
  char *local_1a0;
  size_t local_198;
  size_t local_190;
  byte local_181;
  Option *pOStack_180;
  bool MultiArg;
  char *local_178;
  size_t local_170;
  size_t local_168;
  StringRef local_160;
  Twine local_150;
  Twine local_138;
  Twine local_120;
  Twine local_108;
  Twine local_f0;
  StringRef local_d8;
  Twine local_c8;
  Option *local_b0;
  StringRef local_a0;
  Twine local_90;
  uint local_78;
  int local_74;
  uint NumAdditionalVals;
  int argc_local;
  Option *Handler_local;
  StringRef Value_local;
  StringRef ArgName_local;
  
  Value_local.Data = (char *)Value.Length;
  Handler_local = (Option *)Value.Data;
  sVar6 = ArgName.Length;
  Value_local.Length = (size_t)ArgName.Data;
  local_74 = argc;
  _NumAdditionalVals = Handler;
  local_78 = llvm::cl::Option::getNumAdditionalVals(Handler);
  VVar4 = llvm::cl::Option::getValueExpectedFlag(_NumAdditionalVals);
  pOVar2 = _NumAdditionalVals;
  if (VVar4 != ValueOptional) {
    if (VVar4 == ValueRequired) {
      if (Handler_local == (Option *)0x0) {
        if (local_74 <= *i + 1) {
          llvm::Twine::Twine(&local_90,"requires a value!");
          memset(&local_a0,0,0x10);
          llvm::StringRef::StringRef(&local_a0);
          prVar5 = llvm::errs();
          bVar3 = llvm::cl::Option::error(pOVar2,&local_90,local_a0,prVar5);
          return bVar3;
        }
        if (argv == (char **)0x0) {
          __assert_fail("argv && \"null check\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/CommandLine.cpp"
                        ,0x221,
                        "bool ProvideOption(Option *, StringRef, StringRef, int, const char *const *, int &)"
                       );
        }
        iVar1 = *i;
        *i = iVar1 + 1;
        local_b0 = (Option *)argv[iVar1 + 1];
        if (local_b0 == (Option *)0x0) {
          local_228 = (char *)0x0;
        }
        else {
          local_228 = (char *)strlen((char *)local_b0);
        }
        Handler_local = local_b0;
        Value_local.Data = local_228;
      }
    }
    else if (VVar4 == ValueDisallowed) {
      if (local_78 != 0) {
        llvm::Twine::Twine(&local_c8,"multi-valued option specified with ValueDisallowed modifier!")
        ;
        memset(&local_d8,0,0x10);
        llvm::StringRef::StringRef(&local_d8);
        prVar5 = llvm::errs();
        bVar3 = llvm::cl::Option::error(pOVar2,&local_c8,local_d8,prVar5);
        return bVar3;
      }
      if (Handler_local != (Option *)0x0) {
        llvm::Twine::Twine(&local_120,"does not allow a value! \'");
        llvm::Twine::Twine(&local_138,(StringRef *)&Handler_local);
        llvm::operator+(&local_108,&local_120,&local_138);
        llvm::Twine::Twine(&local_150,"\' specified.");
        llvm::operator+(&local_f0,&local_108,&local_150);
        memset(&local_160,0,0x10);
        llvm::StringRef::StringRef(&local_160);
        prVar5 = llvm::errs();
        bVar3 = llvm::cl::Option::error(pOVar2,&local_f0,local_160,prVar5);
        return bVar3;
      }
    }
  }
  if (local_78 == 0) {
    local_170 = Value_local.Length;
    pOStack_180 = Handler_local;
    local_178 = Value_local.Data;
    ArgName_02.Length = sVar6;
    ArgName_02.Data = (char *)Value_local.Length;
    Value_02.Length = (size_t)Value_local.Data;
    Value_02.Data = (char *)Handler_local;
    local_168 = sVar6;
    ArgName_local.Length._7_1_ =
         CommaSeparateAndAddOccurrence(_NumAdditionalVals,*i,ArgName_02,Value_02,false);
  }
  else {
    local_181 = 0;
    if (Handler_local != (Option *)0x0) {
      local_198 = Value_local.Length;
      local_1a8 = Handler_local;
      local_1a0 = Value_local.Data;
      ArgName_01.Length = sVar6;
      ArgName_01.Data = (char *)Value_local.Length;
      Value_01.Length = (size_t)Value_local.Data;
      Value_01.Data = (char *)Handler_local;
      local_190 = sVar6;
      bVar3 = CommaSeparateAndAddOccurrence(_NumAdditionalVals,*i,ArgName_01,Value_01,false);
      if (bVar3) {
        return true;
      }
      local_78 = local_78 - 1;
      local_181 = 1;
    }
    for (; pOVar2 = _NumAdditionalVals, local_78 != 0; local_78 = local_78 - 1) {
      if (local_74 <= *i + 1) {
        llvm::Twine::Twine(&local_1c0,"not enough values!");
        memset(&local_1d0,0,0x10);
        llvm::StringRef::StringRef(&local_1d0);
        prVar5 = llvm::errs();
        bVar3 = llvm::cl::Option::error(pOVar2,&local_1c0,local_1d0,prVar5);
        return bVar3;
      }
      if (argv == (char **)0x0) {
        __assert_fail("argv && \"null check\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/CommandLine.cpp"
                      ,0x243,
                      "bool ProvideOption(Option *, StringRef, StringRef, int, const char *const *, int &)"
                     );
      }
      iVar1 = *i;
      *i = iVar1 + 1;
      pOVar2 = (Option *)argv[iVar1 + 1];
      if (pOVar2 == (Option *)0x0) {
        local_258 = (char *)0x0;
      }
      else {
        local_258 = (char *)strlen((char *)pOVar2);
      }
      Value_local.Data = local_258;
      ArgName_00.Length = sVar6;
      ArgName_00.Data = (char *)Value_local.Length;
      Value_00.Length = (size_t)local_258;
      Value_00.Data = (char *)pOVar2;
      Handler_local = pOVar2;
      bVar3 = CommaSeparateAndAddOccurrence
                        (_NumAdditionalVals,*i,ArgName_00,Value_00,(bool)(local_181 & 1));
      if (bVar3) {
        return true;
      }
      local_181 = 1;
    }
    ArgName_local.Length._7_1_ = false;
  }
  return ArgName_local.Length._7_1_;
}

Assistant:

static inline bool ProvideOption(Option *Handler, StringRef ArgName,
                                 StringRef Value, int argc,
                                 const char *const *argv, int &i) {
  // Is this a multi-argument option?
  unsigned NumAdditionalVals = Handler->getNumAdditionalVals();

  // Enforce value requirements
  switch (Handler->getValueExpectedFlag()) {
  case ValueRequired:
    if (!Value.data()) { // No value specified?
      if (i + 1 >= argc)
        return Handler->error("requires a value!");
      // Steal the next argument, like for '-o filename'
      assert(argv && "null check");
      Value = StringRef(argv[++i]);
    }
    break;
  case ValueDisallowed:
    if (NumAdditionalVals > 0)
      return Handler->error("multi-valued option specified"
                            " with ValueDisallowed modifier!");

    if (Value.data())
      return Handler->error("does not allow a value! '" + Twine(Value) +
                            "' specified.");
    break;
  case ValueOptional:
    break;
  }

  // If this isn't a multi-arg option, just run the handler.
  if (NumAdditionalVals == 0)
    return CommaSeparateAndAddOccurrence(Handler, i, ArgName, Value);

  // If it is, run the handle several times.
  bool MultiArg = false;

  if (Value.data()) {
    if (CommaSeparateAndAddOccurrence(Handler, i, ArgName, Value, MultiArg))
      return true;
    --NumAdditionalVals;
    MultiArg = true;
  }

  while (NumAdditionalVals > 0) {
    if (i + 1 >= argc)
      return Handler->error("not enough values!");
    assert(argv && "null check");
    Value = StringRef(argv[++i]);

    if (CommaSeparateAndAddOccurrence(Handler, i, ArgName, Value, MultiArg))
      return true;
    MultiArg = true;
    --NumAdditionalVals;
  }
  return false;
}